

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkGraphicsPipelineCreateInfo *pipe,SubpassMeta *subpass_meta,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  VkSampleCountFlagBits VVar1;
  int iVar2;
  void *pvVar3;
  VkVertexInputAttributeDescription *pVVar4;
  VkVertexInputBindingDescription *pVVar5;
  VkPipelineColorBlendAttachmentState *pVVar6;
  byte bVar7;
  bool bVar8;
  bool bVar9;
  ulong uVar10;
  VkPipelineMultisampleStateCreateInfo *pVVar11;
  VkPipelineVertexInputStateCreateInfo *pVVar12;
  VkPipelineViewportStateCreateInfo *pVVar13;
  uint32_t i_5;
  SizeType SVar14;
  long lVar15;
  uint32_t i;
  ulong uVar16;
  uint32_t i_1;
  Value *pVVar17;
  uint uVar18;
  VkPipelineColorBlendStateCreateInfo *pVVar19;
  float value;
  GlobalStateInfo GVar20;
  Value tess;
  Value att;
  Data local_688;
  Value sm;
  Value nexts;
  undefined8 local_648;
  undefined8 uStack_640;
  undefined8 local_638;
  undefined8 uStack_630;
  undefined8 local_628;
  undefined8 uStack_620;
  Value bindings;
  DynamicStateInfo dynamic_info;
  Value attachments;
  StringRefType local_5a0;
  StringRefType local_590;
  StringRefType local_580;
  StringRefType local_570;
  StringRefType local_560;
  StringRefType local_550;
  StringRefType local_540;
  StringRefType local_530;
  StringRefType local_520;
  StringRefType local_510;
  StringRefType local_500;
  StringRefType local_4f0;
  StringRefType local_4e0;
  StringRefType local_4d0;
  StringRefType local_4c0;
  StringRefType local_4b0;
  StringRefType local_4a0;
  StringRefType local_490;
  StringRefType local_480;
  StringRefType local_470;
  StringRefType local_460;
  StringRefType local_450;
  StringRefType local_440;
  StringRefType local_430;
  StringRefType local_420;
  StringRefType local_410;
  StringRefType local_400;
  StringRefType local_3f0;
  StringRefType local_3e0;
  StringRefType local_3d0;
  StringRefType local_3c0;
  StringRefType local_3b0;
  StringRefType local_3a0;
  StringRefType local_390;
  StringRefType local_380;
  StringRefType local_370;
  StringRefType local_360;
  StringRefType local_350;
  StringRefType local_340;
  StringRefType local_330;
  StringRefType local_320;
  StringRefType local_310;
  StringRefType local_300;
  StringRefType local_2f0;
  StringRefType local_2e0;
  StringRefType local_2d0;
  StringRefType local_2c0;
  StringRefType local_2b0;
  StringRefType local_2a0;
  StringRefType local_290;
  StringRefType local_280;
  StringRefType local_270;
  StringRefType local_260;
  StringRefType local_250;
  StringRefType local_240;
  StringRefType local_230;
  StringRefType local_220;
  StringRefType local_210;
  StringRefType local_200;
  StringRefType local_1f0;
  StringRefType local_1e0;
  StringRefType local_1d0;
  StringRefType local_1c0;
  StringRefType local_1b0;
  StringRefType local_1a0;
  StringRefType local_190;
  StringRefType local_180;
  StringRefType local_170;
  StringRefType local_160;
  StringRefType local_150;
  StringRefType local_140;
  StringRefType local_130;
  StringRefType local_120;
  StringRefType local_110;
  StringRefType local_100;
  StringRefType local_f0;
  StringRefType local_e0;
  StringRefType local_d0;
  StringRefType local_c0;
  StringRefType local_b0;
  StringRefType local_a0;
  StringRefType local_90;
  StringRefType local_80;
  StringRefType local_70;
  StringRefType local_60;
  StringRefType local_50;
  StringRefType local_40;
  
  local_688.n.i64 = (Number)0x0;
  local_688.s.str = (Ch *)0x3000000000000;
  local_40.s = "flags";
  local_40.length = 5;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_688.s,&local_40,pipe->flags,alloc);
  local_50.s = "basePipelineHandle";
  local_50.length = 0x12;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&dynamic_info,(uint64_t)pipe->basePipelineHandle,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_688.s,&local_50,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,alloc);
  local_60.s = "basePipelineIndex";
  local_60.length = 0x11;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<int>((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)&local_688.s,&local_60,pipe->basePipelineIndex,alloc);
  local_70.s = "layout";
  local_70.length = 6;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&dynamic_info,(uint64_t)pipe->layout,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_688.s,&local_70,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,alloc);
  local_80.s = "renderPass";
  local_80.length = 10;
  uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
            ((Fossilize *)&dynamic_info,(uint64_t)pipe->renderPass,alloc);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_688.s,&local_80,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&dynamic_info,alloc);
  local_90.s = "subpass";
  local_90.length = 7;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember<unsigned_int>
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
              *)&local_688.s,&local_90,pipe->subpass,alloc);
  dynamic_info.color_blend_advanced = false;
  dynamic_info.provoking_vertex_mode = false;
  dynamic_info.line_rasterization_mode = false;
  dynamic_info.line_stipple_enable = false;
  dynamic_info.depth_clip_negative_one_to_one = false;
  dynamic_info.viewport_w_scaling_enable = false;
  dynamic_info.viewport_swizzle = false;
  dynamic_info.coverage_to_color_enable = false;
  dynamic_info.coverage_to_color_location = false;
  dynamic_info.coverage_modulation_mode = false;
  dynamic_info.coverage_modulation_table_enable = false;
  dynamic_info.coverage_modulation_table = false;
  dynamic_info.shading_rate_image_enable = false;
  dynamic_info.representative_fragment_test_enable = false;
  dynamic_info.coverage_reduction_mode = false;
  dynamic_info.depth_clamp_range = false;
  dynamic_info.tessellation_domain_origin = false;
  dynamic_info.depth_clamp_enable = false;
  dynamic_info.polygon_mode = false;
  dynamic_info.rasterization_samples = false;
  dynamic_info.sample_mask = false;
  dynamic_info.alpha_to_coverage_enable = false;
  dynamic_info.alpha_to_one_enable = false;
  dynamic_info.logic_op_enable = false;
  dynamic_info.color_blend_enable = false;
  dynamic_info.color_blend_equation = false;
  dynamic_info.color_write_mask = false;
  dynamic_info.rasterization_stream = false;
  dynamic_info.conservative_rasterization_mode = false;
  dynamic_info.extra_primitive_overestimation_size = false;
  dynamic_info.depth_clip_enable = false;
  dynamic_info.sample_locations_enable = false;
  dynamic_info.depth_bounds_test_enable = false;
  dynamic_info.stencil_test_enable = false;
  dynamic_info.stencil_op = false;
  dynamic_info.vertex_input = false;
  dynamic_info.vertex_input_binding_stride = false;
  dynamic_info.patch_control_points = false;
  dynamic_info.rasterizer_discard_enable = false;
  dynamic_info.primitive_restart_enable = false;
  dynamic_info.logic_op = false;
  dynamic_info.color_write_enable = false;
  dynamic_info.depth_bias_enable = false;
  dynamic_info.discard_rectangle = false;
  dynamic_info.discard_rectangle_mode = false;
  dynamic_info.fragment_shading_rate = false;
  dynamic_info.sample_locations = false;
  dynamic_info.line_stipple = false;
  dynamic_info.stencil_compare = false;
  dynamic_info.stencil_reference = false;
  dynamic_info.stencil_write_mask = false;
  dynamic_info.depth_bounds = false;
  dynamic_info.depth_bias = false;
  dynamic_info.line_width = false;
  dynamic_info.blend_constants = false;
  dynamic_info.scissor = false;
  dynamic_info.viewport = false;
  dynamic_info.scissor_count = false;
  dynamic_info.viewport_count = false;
  dynamic_info.cull_mode = false;
  dynamic_info.front_face = false;
  dynamic_info.depth_test_enable = false;
  dynamic_info.depth_write_enable = false;
  dynamic_info.depth_compare_op = false;
  if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
    Hashing::parse_dynamic_state_info((DynamicStateInfo *)&nexts,pipe->pDynamicState);
    dynamic_info._48_8_ = local_628;
    dynamic_info._56_8_ = uStack_620;
    dynamic_info._32_8_ = local_638;
    dynamic_info._40_8_ = uStack_630;
    dynamic_info._16_8_ = local_648;
    dynamic_info._24_8_ = uStack_640;
    dynamic_info._0_8_ = nexts.data_.n;
    dynamic_info._8_8_ = nexts.data_.s.str;
  }
  GVar20 = Hashing::parse_global_state_info(pipe,&dynamic_info,subpass_meta);
  uVar10 = GVar20._0_8_;
  uVar18 = GVar20._0_4_;
  if ((uVar18 >> 8 & 1) == 0) {
LAB_00120a58:
    if (pipe->pDynamicState != (VkPipelineDynamicStateCreateInfo *)0x0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                (pipe->pDynamicState,alloc,&nexts);
      local_d0.s = "dynamicState";
      local_d0.length = 0xc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_d0,&nexts,alloc);
    }
    if ((uVar18 >> 0x18 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      local_e0.s = "flags";
      local_e0.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_e0,pipe->pMultisampleState->flags,alloc);
      local_f0.s = "rasterizationSamples";
      local_f0.length = 0x14;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkSampleCountFlagBits>
                (&tess,&local_f0,pipe->pMultisampleState->rasterizationSamples,alloc);
      local_100.s = "sampleShadingEnable";
      local_100.length = 0x13;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_100,pipe->pMultisampleState->sampleShadingEnable,alloc)
      ;
      local_110.s = "minSampleShading";
      local_110.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<float>(&tess,&local_110,pipe->pMultisampleState->minSampleShading,alloc);
      local_120.s = "alphaToOneEnable";
      local_120.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_120,pipe->pMultisampleState->alphaToOneEnable,alloc);
      local_130.s = "alphaToCoverageEnable";
      local_130.length = 0x15;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                (&tess,&local_130,pipe->pMultisampleState->alphaToCoverageEnable,alloc);
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x4000000000000;
      pVVar11 = pipe->pMultisampleState;
      if (pVVar11->pSampleMask != (VkSampleMask *)0x0) {
        VVar1 = pVVar11->rasterizationSamples;
        for (uVar16 = 0;
            VVar1 + (VK_SAMPLE_COUNT_16_BIT|VK_SAMPLE_COUNT_8_BIT|VK_SAMPLE_COUNT_4_BIT|
                     VK_SAMPLE_COUNT_2_BIT|VK_SAMPLE_COUNT_1_BIT) >> 5 != uVar16;
            uVar16 = uVar16 + 1) {
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack<unsigned_int>(&sm,pipe->pMultisampleState->pSampleMask[uVar16],alloc);
        }
        local_140.s = "sampleMask";
        local_140.length = 10;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,&local_140,&sm,alloc);
        pVVar11 = pipe->pMultisampleState;
      }
      if (pVVar11->pNext != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar9 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pVVar11->pNext,alloc,&nexts,&dynamic_info);
        if (!bVar9) goto LAB_0012202b;
        att.data_.n = (Number)anon_var_dwarf_3d75c;
        att.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(StringRefType *)&att,&nexts,alloc);
      }
      local_150.s = "multisampleState";
      local_150.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_150,&tess,alloc);
    }
    if ((uVar10 >> 0x30 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x4000000000000;
      bindings.data_.n = (Number)0x0;
      bindings.data_.s.str = (Ch *)0x4000000000000;
      local_160.s = "flags";
      local_160.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_160,pipe->pVertexInputState->flags,alloc);
      lVar15 = 0xc;
      for (uVar16 = 0; pVVar12 = pipe->pVertexInputState,
          uVar16 < pVVar12->vertexAttributeDescriptionCount; uVar16 = uVar16 + 1) {
        pVVar4 = pVVar12->pVertexAttributeDescriptions;
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x3000000000000;
        local_420.s = "location";
        local_420.length = 8;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&nexts,&local_420,*(uint *)((long)pVVar4 + lVar15 + -0xc),alloc);
        local_430.s = "binding";
        local_430.length = 7;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&nexts,&local_430,*(uint *)((long)pVVar4 + lVar15 + -8),alloc);
        local_440.s = "offset";
        local_440.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>
                  (&nexts,&local_440,*(uint *)((long)&pVVar4->location + lVar15),alloc);
        local_450.s = "format";
        local_450.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkFormat>(&nexts,&local_450,*(VkFormat *)((long)pVVar4 + lVar15 + -4),alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&sm,&nexts,alloc);
        lVar15 = lVar15 + 0x10;
      }
      lVar15 = 8;
      for (uVar16 = 0; uVar16 < pVVar12->vertexBindingDescriptionCount; uVar16 = uVar16 + 1) {
        pVVar5 = pVVar12->pVertexBindingDescriptions;
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x3000000000000;
        local_460.s = "binding";
        local_460.length = 7;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&nexts,&local_460,*(uint *)((long)pVVar5 + lVar15 + -8),alloc);
        local_470.s = "stride";
        local_470.length = 6;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&nexts,&local_470,*(uint *)((long)pVVar5 + lVar15 + -4),alloc);
        local_480.s = "inputRate";
        local_480.length = 9;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkVertexInputRate>
                  (&nexts,&local_480,*(VkVertexInputRate *)((long)&pVVar5->binding + lVar15),alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&bindings,&nexts,alloc);
        pVVar12 = pipe->pVertexInputState;
        lVar15 = lVar15 + 0xc;
      }
      local_170.s = "attributes";
      local_170.length = 10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&local_170,&sm,alloc);
      local_180.s = "bindings";
      local_180.length = 8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&local_180,&bindings,alloc);
      pvVar3 = pipe->pVertexInputState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar9 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar9) goto LAB_0012202b;
        att.data_.n = (Number)anon_var_dwarf_3d75c;
        att.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(StringRefType *)&att,&nexts,alloc);
      }
      local_190.s = "vertexInputState";
      local_190.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_190,&tess,alloc);
    }
    if ((uVar10 >> 0x38 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      local_1a0.s = "flags";
      local_1a0.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_1a0,pipe->pRasterizationState->flags,alloc);
      local_1b0.s = "depthBiasConstantFactor";
      local_1b0.length = 0x17;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<float>(&tess,&local_1b0,pipe->pRasterizationState->depthBiasConstantFactor,alloc);
      local_1c0.s = "depthBiasSlopeFactor";
      local_1c0.length = 0x14;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<float>(&tess,&local_1c0,pipe->pRasterizationState->depthBiasSlopeFactor,alloc);
      local_1d0.s = "depthBiasClamp";
      local_1d0.length = 0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<float>(&tess,&local_1d0,pipe->pRasterizationState->depthBiasClamp,alloc);
      local_1e0.s = "depthBiasEnable";
      local_1e0.length = 0xf;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_1e0,pipe->pRasterizationState->depthBiasEnable,alloc);
      local_1f0.s = "depthClampEnable";
      local_1f0.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_1f0,pipe->pRasterizationState->depthClampEnable,alloc);
      local_200.s = "polygonMode";
      local_200.length = 0xb;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPolygonMode>(&tess,&local_200,pipe->pRasterizationState->polygonMode,alloc);
      local_210.s = "rasterizerDiscardEnable";
      local_210.length = 0x17;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                (&tess,&local_210,pipe->pRasterizationState->rasterizerDiscardEnable,alloc);
      local_220.s = "frontFace";
      local_220.length = 9;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkFrontFace>(&tess,&local_220,pipe->pRasterizationState->frontFace,alloc);
      local_230.s = "lineWidth";
      local_230.length = 9;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<float>(&tess,&local_230,pipe->pRasterizationState->lineWidth,alloc);
      local_240.s = "cullMode";
      local_240.length = 8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_240,pipe->pRasterizationState->cullMode,alloc);
      pvVar3 = pipe->pRasterizationState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar9 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar9) goto LAB_0012202b;
        att.data_.n = (Number)anon_var_dwarf_3d75c;
        att.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(StringRefType *)&att,&nexts,alloc);
      }
      local_250.s = "rasterizationState";
      local_250.length = 0x12;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_250,&tess,alloc);
    }
    if (((undefined1  [11])GVar20 & (undefined1  [11])0x1) != (undefined1  [11])0x0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      local_260.s = "flags";
      local_260.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_260,pipe->pInputAssemblyState->flags,alloc);
      local_270.s = "topology";
      local_270.length = 8;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkPrimitiveTopology>(&tess,&local_270,pipe->pInputAssemblyState->topology,alloc);
      local_280.s = "primitiveRestartEnable";
      local_280.length = 0x16;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                (&tess,&local_280,pipe->pInputAssemblyState->primitiveRestartEnable,alloc);
      pvVar3 = pipe->pInputAssemblyState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar9 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar9) goto LAB_0012202b;
        att.data_.n = (Number)anon_var_dwarf_3d75c;
        att.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(StringRefType *)&att,&nexts,alloc);
      }
      local_290.s = "inputAssemblyState";
      local_290.length = 0x12;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_290,&tess,alloc);
    }
    if ((uVar10 >> 0x28 & 1) != 0) {
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x3000000000000;
      local_2a0.s = "flags";
      local_2a0.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&sm,&local_2a0,pipe->pColorBlendState->flags,alloc);
      local_2b0.s = "logicOp";
      local_2b0.length = 7;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkLogicOp>(&sm,&local_2b0,pipe->pColorBlendState->logicOp,alloc);
      local_2c0.s = "logicOpEnable";
      local_2c0.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&sm,&local_2c0,pipe->pColorBlendState->logicOpEnable,alloc);
      if (((dynamic_info.color_blend_enable == true) && (dynamic_info.color_write_mask == true)) &&
         (dynamic_info.color_blend_equation == true)) {
        pVVar19 = pipe->pColorBlendState;
        bVar8 = true;
        bVar9 = false;
      }
      else {
        pVVar19 = pipe->pColorBlendState;
        bVar7 = 0;
        for (lVar15 = 0; (ulong)pVVar19->attachmentCount << 5 != lVar15; lVar15 = lVar15 + 0x20) {
          pVVar6 = pVVar19->pAttachments;
          if ((*(int *)((long)&pVVar6->blendEnable + lVar15) != 0) &&
             (((((iVar2 = *(int *)((long)&pVVar6->dstAlphaBlendFactor + lVar15), iVar2 == 10 ||
                 (iVar2 == 0xc)) ||
                ((iVar2 = *(int *)((long)&pVVar6->srcAlphaBlendFactor + lVar15), iVar2 == 10 ||
                 ((iVar2 == 0xc ||
                  (iVar2 = *(int *)((long)&pVVar6->dstColorBlendFactor + lVar15), iVar2 == 10))))))
               || (iVar2 == 0xc)) ||
              ((iVar2 = *(int *)((long)&pVVar6->srcColorBlendFactor + lVar15), iVar2 == 0xc ||
               (iVar2 == 10)))))) {
            bVar7 = 1;
          }
        }
        bVar9 = (bool)(bVar7 ^ 1);
        bVar8 = false;
      }
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      bindings.data_.n = (Number)0x0;
      bindings.data_.s.str = (Ch *)0x4000000000000;
      for (lVar15 = 0; lVar15 != 0x10; lVar15 = lVar15 + 4) {
        value = 0.0;
        if ((dynamic_info._0_8_ & 0x1000000000000) == 0 && !bVar9) {
          value = *(float *)((long)pVVar19->blendConstants + lVar15);
        }
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack<float>(&bindings,value,alloc);
      }
      local_2d0.s = "blendConstants";
      local_2d0.length = 0xe;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&local_2d0,&bindings,alloc);
      attachments.data_.n = (Number)0x0;
      attachments.data_.s.str = (Ch *)0x4000000000000;
      lVar15 = 0;
      uVar16 = 0;
      while( true ) {
        if (pipe->pColorBlendState->attachmentCount <= uVar16) break;
        pVVar17 = &nexts;
        if (!bVar8) {
          pVVar17 = (Value *)((long)&pipe->pColorBlendState->pAttachments->blendEnable + lVar15);
        }
        att.data_.n = (Number)0x0;
        att.data_.s.str = (Ch *)0x3000000000000;
        local_490.s = "dstAlphaBlendFactor";
        local_490.length = 0x13;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkBlendFactor>(&att,&local_490,pVVar17[1].data_.s.hashcode,alloc);
        local_4a0.s = "srcAlphaBlendFactor";
        local_4a0.length = 0x13;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkBlendFactor>(&att,&local_4a0,pVVar17[1].data_.s.length,alloc);
        local_4b0.s = "dstColorBlendFactor";
        local_4b0.length = 0x13;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkBlendFactor>
                  (&att,&local_4b0,*(VkBlendFactor *)((long)&pVVar17->data_ + 8),alloc);
        local_4c0.s = "srcColorBlendFactor";
        local_4c0.length = 0x13;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkBlendFactor>(&att,&local_4c0,(pVVar17->data_).s.hashcode,alloc);
        local_4d0.s = "colorWriteMask";
        local_4d0.length = 0xe;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&att,&local_4d0,*(uint *)((long)&pVVar17[1].data_ + 0xc),alloc);
        local_4e0.s = "alphaBlendOp";
        local_4e0.length = 0xc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkBlendOp>(&att,&local_4e0,*(VkBlendOp *)((long)&pVVar17[1].data_ + 8),alloc);
        local_4f0.s = "colorBlendOp";
        local_4f0.length = 0xc;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<VkBlendOp>(&att,&local_4f0,*(VkBlendOp *)((long)&pVVar17->data_ + 0xc),alloc);
        local_500.s = "blendEnable";
        local_500.length = 0xb;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>(&att,&local_500,(pVVar17->data_).s.length,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack(&attachments,&att,alloc);
        uVar16 = uVar16 + 1;
        lVar15 = lVar15 + 0x20;
      }
      local_2e0.s = "attachments";
      local_2e0.length = 0xb;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&sm,&local_2e0,&attachments,alloc);
      pvVar3 = pipe->pColorBlendState->pNext;
      if (pvVar3 != (void *)0x0) {
        att.data_.n = (Number)0x0;
        att.data_.s.str = (Ch *)0x0;
        bVar9 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&att,&dynamic_info);
        if (!bVar9) goto LAB_0012202b;
        tess.data_.n = (Number)anon_var_dwarf_3d75c;
        tess.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&sm,(StringRefType *)&tess,&att,alloc);
      }
      local_2f0.s = "colorBlendState";
      local_2f0.length = 0xf;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_2f0,&sm,alloc);
    }
    if ((uVar18 >> 0x10 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      local_300.s = "flags";
      local_300.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_300,pipe->pViewportState->flags,alloc);
      local_310.s = "viewportCount";
      local_310.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_310,pipe->pViewportState->viewportCount,alloc);
      local_320.s = "scissorCount";
      local_320.length = 0xc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_320,pipe->pViewportState->scissorCount,alloc);
      pVVar13 = pipe->pViewportState;
      if (pVVar13->pViewports != (VkViewport *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x4000000000000;
        lVar15 = 0;
        for (uVar16 = 0; uVar16 < pVVar13->viewportCount; uVar16 = uVar16 + 1) {
          att.data_.n = (Number)0x0;
          att.data_.s.str = (Ch *)0x3000000000000;
          local_510.s = "x";
          local_510.length = 1;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<float>(&att,&local_510,*(float *)((long)&pVVar13->pViewports->x + lVar15),
                             alloc);
          local_520.s = "y";
          local_520.length = 1;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<float>(&att,&local_520,
                             *(float *)((long)&pipe->pViewportState->pViewports->y + lVar15),alloc);
          local_530.s = "width";
          local_530.length = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<float>(&att,&local_530,
                             *(float *)((long)&pipe->pViewportState->pViewports->width + lVar15),
                             alloc);
          local_540.s = "height";
          local_540.length = 6;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<float>(&att,&local_540,
                             *(float *)((long)&pipe->pViewportState->pViewports->height + lVar15),
                             alloc);
          local_550.s = "minDepth";
          local_550.length = 8;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<float>(&att,&local_550,
                             *(float *)((long)&pipe->pViewportState->pViewports->minDepth + lVar15),
                             alloc);
          local_560.s = "maxDepth";
          local_560.length = 8;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<float>(&att,&local_560,
                             *(float *)((long)&pipe->pViewportState->pViewports->maxDepth + lVar15),
                             alloc);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(&nexts,&att,alloc);
          pVVar13 = pipe->pViewportState;
          lVar15 = lVar15 + 0x18;
        }
        local_330.s = "viewports";
        local_330.length = 9;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,&local_330,&nexts,alloc);
        pVVar13 = pipe->pViewportState;
      }
      if (pVVar13->pScissors != (VkRect2D *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x4000000000000;
        lVar15 = 0;
        for (uVar16 = 0; uVar16 < pVVar13->scissorCount; uVar16 = uVar16 + 1) {
          att.data_.n = (Number)0x0;
          att.data_.s.str = (Ch *)0x3000000000000;
          local_570.s = "x";
          local_570.length = 1;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<int>(&att,&local_570,*(int *)((long)&(pVVar13->pScissors->offset).x + lVar15),
                           alloc);
          local_580.s = "y";
          local_580.length = 1;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<int>(&att,&local_580,
                           *(int *)((long)&(pipe->pViewportState->pScissors->offset).y + lVar15),
                           alloc);
          local_590.s = "width";
          local_590.length = 5;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<unsigned_int>
                    (&att,&local_590,
                     *(uint *)((long)&(pipe->pViewportState->pScissors->extent).width + lVar15),
                     alloc);
          local_5a0.s = "height";
          local_5a0.length = 6;
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::AddMember<unsigned_int>
                    (&att,&local_5a0,
                     *(uint *)((long)&(pipe->pViewportState->pScissors->extent).height + lVar15),
                     alloc);
          rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::PushBack(&nexts,&att,alloc);
          pVVar13 = pipe->pViewportState;
          lVar15 = lVar15 + 0x10;
        }
        local_340.s = "scissors";
        local_340.length = 8;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,&local_340,&nexts,alloc);
        pVVar13 = pipe->pViewportState;
      }
      if (pVVar13->pNext != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar9 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pVVar13->pNext,alloc,&nexts,&dynamic_info);
        if (!bVar9) goto LAB_0012202b;
        att.data_.n = (Number)anon_var_dwarf_3d75c;
        att.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(StringRefType *)&att,&nexts,alloc);
      }
      local_350.s = "viewportState";
      local_350.length = 0xd;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_350,&tess,alloc);
    }
    if ((uVar10 >> 0x20 & 1) != 0) {
      tess.data_.n = (Number)0x0;
      tess.data_.s.str = (Ch *)0x3000000000000;
      local_360.s = "flags";
      local_360.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_360,pipe->pDepthStencilState->flags,alloc);
      local_370.s = "stencilTestEnable";
      local_370.length = 0x11;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_370,pipe->pDepthStencilState->stencilTestEnable,alloc);
      local_380.s = "maxDepthBounds";
      SVar14 = 0xe;
      local_380.length = SVar14;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<float>(&tess,&local_380,pipe->pDepthStencilState->maxDepthBounds,alloc);
      local_390.s = "minDepthBounds";
      local_390.length = SVar14;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<float>(&tess,&local_390,pipe->pDepthStencilState->minDepthBounds,alloc);
      local_3a0.s = "depthBoundsTestEnable";
      local_3a0.length = 0x15;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>
                (&tess,&local_3a0,pipe->pDepthStencilState->depthBoundsTestEnable,alloc);
      local_3b0.s = "depthWriteEnable";
      local_3b0.length = 0x10;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_3b0,pipe->pDepthStencilState->depthWriteEnable,alloc);
      local_3c0.s = "depthTestEnable";
      local_3c0.length = 0xf;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_int>(&tess,&local_3c0,pipe->pDepthStencilState->depthTestEnable,alloc);
      local_3d0.s = "depthCompareOp";
      local_3d0.length = SVar14;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<VkCompareOp>(&tess,&local_3d0,pipe->pDepthStencilState->depthCompareOp,alloc);
      sm.data_.n = (Number)0x0;
      sm.data_.s.str = (Ch *)0x3000000000000;
      bindings.data_.n = (Number)0x0;
      bindings.data_.s.str = (Ch *)0x3000000000000;
      attachments.data_.n = (Number)alloc;
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::anon_class_8_1_a7a39255
      ::operator()((anon_class_8_1_a7a39255 *)&attachments,&sm,&pipe->pDepthStencilState->front);
      json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::anon_class_8_1_a7a39255
      ::operator()((anon_class_8_1_a7a39255 *)&attachments,&bindings,&pipe->pDepthStencilState->back
                  );
      local_3e0.s = "front";
      local_3e0.length = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&local_3e0,&sm,alloc);
      local_3f0.s = "back";
      local_3f0.length = 4;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,&local_3f0,&bindings,alloc);
      pvVar3 = pipe->pDepthStencilState->pNext;
      if (pvVar3 != (void *)0x0) {
        nexts.data_.n = (Number)0x0;
        nexts.data_.s.str = (Ch *)0x0;
        bVar9 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                          (pvVar3,alloc,&nexts,&dynamic_info);
        if (!bVar9) goto LAB_0012202b;
        att.data_.n = (Number)anon_var_dwarf_3d75c;
        att.data_._8_4_ = 5;
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember(&tess,(StringRefType *)&att,&nexts,alloc);
      }
      local_400.s = "depthStencilState";
      local_400.length = 0x11;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_400,&tess,alloc);
    }
    if ((GVar20._8_3_ >> 0x10 & 1) != 0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      bVar9 = json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pStages,pipe->stageCount,alloc,&nexts);
      if (!bVar9) goto LAB_0012202b;
      local_410.s = "stages";
      local_410.length = 6;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_410,&nexts,alloc);
    }
    if (pipe->pNext != (void *)0x0) {
      nexts.data_.n = (Number)0x0;
      nexts.data_.s.str = (Ch *)0x0;
      bVar9 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                        (pipe->pNext,alloc,&nexts,&dynamic_info);
      if (!bVar9) goto LAB_0012202b;
      att.data_.n = (Number)anon_var_dwarf_3d75c;
      att.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,(StringRefType *)&att,&nexts,alloc);
    }
    bVar9 = true;
    if (&local_688 != &out_value->data_) {
      (out_value->data_).n = local_688.n;
      (out_value->data_).s.str = local_688.s.str;
    }
  }
  else {
    tess.data_.n = (Number)0x0;
    tess.data_.s.str = (Ch *)0x3000000000000;
    local_a0.s = "flags";
    local_a0.length = 5;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>(&tess,&local_a0,pipe->pTessellationState->flags,alloc);
    local_b0.s = "patchControlPoints";
    local_b0.length = 0x12;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>(&tess,&local_b0,pipe->pTessellationState->patchControlPoints,alloc);
    pvVar3 = pipe->pTessellationState->pNext;
    if (pvVar3 == (void *)0x0) {
LAB_00120a2d:
      local_c0.s = "tessellationState";
      local_c0.length = 0x11;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)&local_688.s,&local_c0,&tess,alloc);
      goto LAB_00120a58;
    }
    nexts.data_.n = (Number)0x0;
    nexts.data_.s.str = (Ch *)0x0;
    bVar9 = pnext_chain_json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      (pvVar3,alloc,&nexts,&dynamic_info);
    if (bVar9) {
      att.data_.n = (Number)anon_var_dwarf_3d75c;
      att.data_._8_4_ = 5;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember(&tess,(StringRefType *)&att,&nexts,alloc);
      goto LAB_00120a2d;
    }
LAB_0012202b:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

static bool json_value(const VkGraphicsPipelineCreateInfo &pipe,
                       const StateRecorder::SubpassMeta &subpass_meta,
                       Allocator &alloc, Value *out_value)
{
	Value p(kObjectType);
	p.AddMember("flags", pipe.flags, alloc);
	p.AddMember("basePipelineHandle", uint64_string(api_object_cast<uint64_t>(pipe.basePipelineHandle), alloc), alloc);
	p.AddMember("basePipelineIndex", pipe.basePipelineIndex, alloc);
	p.AddMember("layout", uint64_string(api_object_cast<uint64_t>(pipe.layout), alloc), alloc);
	p.AddMember("renderPass", uint64_string(api_object_cast<uint64_t>(pipe.renderPass), alloc), alloc);
	p.AddMember("subpass", pipe.subpass, alloc);

	DynamicStateInfo dynamic_info = {};
	if (pipe.pDynamicState)
		dynamic_info = Hashing::parse_dynamic_state_info(*pipe.pDynamicState);
	GlobalStateInfo global_info = Hashing::parse_global_state_info(pipe, dynamic_info, subpass_meta);

	if (global_info.tessellation_state)
	{
		Value tess(kObjectType);
		tess.AddMember("flags", pipe.pTessellationState->flags, alloc);
		tess.AddMember("patchControlPoints", pipe.pTessellationState->patchControlPoints, alloc);
		if (!pnext_chain_add_json_value(tess, *pipe.pTessellationState, alloc, &dynamic_info))
			return false;
		p.AddMember("tessellationState", tess, alloc);
	}

	if (pipe.pDynamicState)
	{
		Value dyn;
		if (!json_value(*pipe.pDynamicState, alloc, &dyn))
			return false;
		p.AddMember("dynamicState", dyn, alloc);
	}

	if (global_info.multisample_state)
	{
		Value ms(kObjectType);
		ms.AddMember("flags", pipe.pMultisampleState->flags, alloc);
		ms.AddMember("rasterizationSamples", pipe.pMultisampleState->rasterizationSamples, alloc);
		ms.AddMember("sampleShadingEnable", pipe.pMultisampleState->sampleShadingEnable, alloc);
		ms.AddMember("minSampleShading", pipe.pMultisampleState->minSampleShading, alloc);
		ms.AddMember("alphaToOneEnable", pipe.pMultisampleState->alphaToOneEnable, alloc);
		ms.AddMember("alphaToCoverageEnable", pipe.pMultisampleState->alphaToCoverageEnable, alloc);

		Value sm(kArrayType);
		if (pipe.pMultisampleState->pSampleMask)
		{
			auto entries = uint32_t(pipe.pMultisampleState->rasterizationSamples + 31) / 32;
			for (uint32_t i = 0; i < entries; i++)
				sm.PushBack(pipe.pMultisampleState->pSampleMask[i], alloc);
			ms.AddMember("sampleMask", sm, alloc);
		}

		if (!pnext_chain_add_json_value(ms, *pipe.pMultisampleState, alloc, &dynamic_info))
			return false;
		p.AddMember("multisampleState", ms, alloc);
	}

	if (global_info.vertex_input)
	{
		Value vi(kObjectType);

		Value attribs(kArrayType);
		Value bindings(kArrayType);
		vi.AddMember("flags", pipe.pVertexInputState->flags, alloc);

		for (uint32_t i = 0; i < pipe.pVertexInputState->vertexAttributeDescriptionCount; i++)
		{
			auto &a = pipe.pVertexInputState->pVertexAttributeDescriptions[i];
			Value attrib(kObjectType);
			attrib.AddMember("location", a.location, alloc);
			attrib.AddMember("binding", a.binding, alloc);
			attrib.AddMember("offset", a.offset, alloc);
			attrib.AddMember("format", a.format, alloc);
			attribs.PushBack(attrib, alloc);
		}

		for (uint32_t i = 0; i < pipe.pVertexInputState->vertexBindingDescriptionCount; i++)
		{
			auto &b = pipe.pVertexInputState->pVertexBindingDescriptions[i];
			Value binding(kObjectType);
			binding.AddMember("binding", b.binding, alloc);
			binding.AddMember("stride", b.stride, alloc);
			binding.AddMember("inputRate", b.inputRate, alloc);
			bindings.PushBack(binding, alloc);
		}
		vi.AddMember("attributes", attribs, alloc);
		vi.AddMember("bindings", bindings, alloc);
		if (!pnext_chain_add_json_value(vi, *pipe.pVertexInputState, alloc, &dynamic_info))
			return false;
		p.AddMember("vertexInputState", vi, alloc);
	}

	if (global_info.rasterization_state)
	{
		Value rs(kObjectType);
		rs.AddMember("flags", pipe.pRasterizationState->flags, alloc);
		rs.AddMember("depthBiasConstantFactor", pipe.pRasterizationState->depthBiasConstantFactor, alloc);
		rs.AddMember("depthBiasSlopeFactor", pipe.pRasterizationState->depthBiasSlopeFactor, alloc);
		rs.AddMember("depthBiasClamp", pipe.pRasterizationState->depthBiasClamp, alloc);
		rs.AddMember("depthBiasEnable", pipe.pRasterizationState->depthBiasEnable, alloc);
		rs.AddMember("depthClampEnable", pipe.pRasterizationState->depthClampEnable, alloc);
		rs.AddMember("polygonMode", pipe.pRasterizationState->polygonMode, alloc);
		rs.AddMember("rasterizerDiscardEnable", pipe.pRasterizationState->rasterizerDiscardEnable, alloc);
		rs.AddMember("frontFace", pipe.pRasterizationState->frontFace, alloc);
		rs.AddMember("lineWidth", pipe.pRasterizationState->lineWidth, alloc);
		rs.AddMember("cullMode", pipe.pRasterizationState->cullMode, alloc);
		if (!pnext_chain_add_json_value(rs, *pipe.pRasterizationState, alloc, &dynamic_info))
			return false;
		p.AddMember("rasterizationState", rs, alloc);
	}

	if (global_info.input_assembly)
	{
		Value ia(kObjectType);
		ia.AddMember("flags", pipe.pInputAssemblyState->flags, alloc);
		ia.AddMember("topology", pipe.pInputAssemblyState->topology, alloc);
		ia.AddMember("primitiveRestartEnable", pipe.pInputAssemblyState->primitiveRestartEnable, alloc);
		if (!pnext_chain_add_json_value(ia, *pipe.pInputAssemblyState, alloc, &dynamic_info))
			return false;
		p.AddMember("inputAssemblyState", ia, alloc);
	}

	if (global_info.color_blend_state)
	{
		Value cb(kObjectType);
		cb.AddMember("flags", pipe.pColorBlendState->flags, alloc);
		cb.AddMember("logicOp", pipe.pColorBlendState->logicOp, alloc);
		cb.AddMember("logicOpEnable", pipe.pColorBlendState->logicOpEnable, alloc);

		bool need_blend_constants = false;
		// Special EDS3 rule. If all of these are set, we must ignore the pAttachments pointer.
		const bool dynamic_attachments = dynamic_info.color_blend_enable &&
		                                 dynamic_info.color_write_mask &&
		                                 dynamic_info.color_blend_equation;

		if (dynamic_attachments)
		{
			need_blend_constants = true;
		}
		else
		{
			for (uint32_t i = 0; i < pipe.pColorBlendState->attachmentCount; i++)
			{
				auto &a = pipe.pColorBlendState->pAttachments[i];

				if (a.blendEnable &&
				    (a.dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.dstAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.srcAlphaBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.dstColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR ||
				     a.srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_ALPHA ||
				     a.srcColorBlendFactor == VK_BLEND_FACTOR_CONSTANT_COLOR))
				{
					need_blend_constants = true;
				}
			}
		}

		const VkPipelineColorBlendAttachmentState blank_attachment = {};

		Value blend_constants(kArrayType);
		for (auto &c : pipe.pColorBlendState->blendConstants)
			blend_constants.PushBack(dynamic_info.blend_constants || !need_blend_constants ? 0.0f : c, alloc);
		cb.AddMember("blendConstants", blend_constants, alloc);
		Value attachments(kArrayType);
		for (uint32_t i = 0; i < pipe.pColorBlendState->attachmentCount; i++)
		{
			// We cannot completely decouple pAttachments from attachmentCount.
			// Just serialize dummy entries.

			auto &a = dynamic_attachments ? blank_attachment : pipe.pColorBlendState->pAttachments[i];
			Value att(kObjectType);
			att.AddMember("dstAlphaBlendFactor", a.dstAlphaBlendFactor, alloc);
			att.AddMember("srcAlphaBlendFactor", a.srcAlphaBlendFactor, alloc);
			att.AddMember("dstColorBlendFactor", a.dstColorBlendFactor, alloc);
			att.AddMember("srcColorBlendFactor", a.srcColorBlendFactor, alloc);
			att.AddMember("colorWriteMask", a.colorWriteMask, alloc);
			att.AddMember("alphaBlendOp", a.alphaBlendOp, alloc);
			att.AddMember("colorBlendOp", a.colorBlendOp, alloc);
			att.AddMember("blendEnable", a.blendEnable, alloc);
			attachments.PushBack(att, alloc);
		}
		cb.AddMember("attachments", attachments, alloc);
		if (!pnext_chain_add_json_value(cb, *pipe.pColorBlendState, alloc, &dynamic_info))
			return false;
		p.AddMember("colorBlendState", cb, alloc);
	}

	if (global_info.viewport_state)
	{
		Value vp(kObjectType);
		vp.AddMember("flags", pipe.pViewportState->flags, alloc);
		vp.AddMember("viewportCount", pipe.pViewportState->viewportCount, alloc);
		vp.AddMember("scissorCount", pipe.pViewportState->scissorCount, alloc);
		if (pipe.pViewportState->pViewports)
		{
			Value viewports(kArrayType);
			for (uint32_t i = 0; i < pipe.pViewportState->viewportCount; i++)
			{
				Value viewport(kObjectType);
				viewport.AddMember("x", pipe.pViewportState->pViewports[i].x, alloc);
				viewport.AddMember("y", pipe.pViewportState->pViewports[i].y, alloc);
				viewport.AddMember("width", pipe.pViewportState->pViewports[i].width, alloc);
				viewport.AddMember("height", pipe.pViewportState->pViewports[i].height, alloc);
				viewport.AddMember("minDepth", pipe.pViewportState->pViewports[i].minDepth, alloc);
				viewport.AddMember("maxDepth", pipe.pViewportState->pViewports[i].maxDepth, alloc);
				viewports.PushBack(viewport, alloc);
			}
			vp.AddMember("viewports", viewports, alloc);
		}

		if (pipe.pViewportState->pScissors)
		{
			Value scissors(kArrayType);
			for (uint32_t i = 0; i < pipe.pViewportState->scissorCount; i++)
			{
				Value scissor(kObjectType);
				scissor.AddMember("x", pipe.pViewportState->pScissors[i].offset.x, alloc);
				scissor.AddMember("y", pipe.pViewportState->pScissors[i].offset.y, alloc);
				scissor.AddMember("width", pipe.pViewportState->pScissors[i].extent.width, alloc);
				scissor.AddMember("height", pipe.pViewportState->pScissors[i].extent.height, alloc);
				scissors.PushBack(scissor, alloc);
			}
			vp.AddMember("scissors", scissors, alloc);
		}
		if (!pnext_chain_add_json_value(vp, *pipe.pViewportState, alloc, &dynamic_info))
			return false;
		p.AddMember("viewportState", vp, alloc);
	}

	if (global_info.depth_stencil_state)
	{
		Value ds(kObjectType);
		ds.AddMember("flags", pipe.pDepthStencilState->flags, alloc);
		ds.AddMember("stencilTestEnable", pipe.pDepthStencilState->stencilTestEnable, alloc);
		ds.AddMember("maxDepthBounds", pipe.pDepthStencilState->maxDepthBounds, alloc);
		ds.AddMember("minDepthBounds", pipe.pDepthStencilState->minDepthBounds, alloc);
		ds.AddMember("depthBoundsTestEnable", pipe.pDepthStencilState->depthBoundsTestEnable, alloc);
		ds.AddMember("depthWriteEnable", pipe.pDepthStencilState->depthWriteEnable, alloc);
		ds.AddMember("depthTestEnable", pipe.pDepthStencilState->depthTestEnable, alloc);
		ds.AddMember("depthCompareOp", pipe.pDepthStencilState->depthCompareOp, alloc);

		const auto serialize_stencil = [&](Value &v, const VkStencilOpState &state) {
			v.AddMember("compareOp", state.compareOp, alloc);
			v.AddMember("writeMask", state.writeMask, alloc);
			v.AddMember("reference", state.reference, alloc);
			v.AddMember("compareMask", state.compareMask, alloc);
			v.AddMember("passOp", state.passOp, alloc);
			v.AddMember("failOp", state.failOp, alloc);
			v.AddMember("depthFailOp", state.depthFailOp, alloc);
		};
		Value front(kObjectType);
		Value back(kObjectType);
		serialize_stencil(front, pipe.pDepthStencilState->front);
		serialize_stencil(back, pipe.pDepthStencilState->back);
		ds.AddMember("front", front, alloc);
		ds.AddMember("back", back, alloc);
		if (!pnext_chain_add_json_value(ds, *pipe.pDepthStencilState, alloc, &dynamic_info))
			return false;
		p.AddMember("depthStencilState", ds, alloc);
	}

	if (global_info.module_state)
	{
		Value stages;
		if (!json_value(pipe.pStages, pipe.stageCount, alloc, &stages))
			return false;
		p.AddMember("stages", stages, alloc);
	}

	if (!pnext_chain_add_json_value(p, pipe, alloc, &dynamic_info))
		return false;

	*out_value = p;
	return true;
}